

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O1

void __thiscall
helics::apps::Source::addPublication
          (Source *this,string_view key,string_view generator,DataType type,Time period,
          string_view units)

{
  bool bVar1;
  _Map_pointer ppSVar2;
  _Map_pointer ppSVar3;
  _Elt_pointer pSVar4;
  _Elt_pointer pSVar5;
  string_view type_00;
  string_view key_00;
  iterator iVar6;
  string *psVar7;
  string *psVar8;
  mapped_type *pmVar9;
  SourceObject *pSVar10;
  long lVar11;
  SourceObject newObj;
  key_type local_228;
  key_type local_218;
  size_t local_208;
  char *pcStack_200;
  SourceObject local_1f8;
  Publication local_f8;
  
  local_228._M_str = generator._M_str;
  local_228._M_len = generator._M_len;
  local_218._M_str = key._M_str;
  local_218._M_len = key._M_len;
  iVar6 = CLI::std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          ::find(&(this->pubids)._M_t,&local_218);
  if ((_Rb_tree_header *)iVar6._M_node == &(this->pubids)._M_t._M_impl.super__Rb_tree_header) {
    bVar1 = (this->super_App).useLocal;
    key_00._M_str = local_218._M_str;
    key_00._M_len = local_218._M_len;
    psVar7 = typeNameStringRef_abi_cxx11_(type);
    pcStack_200 = (psVar7->_M_dataplus)._M_p;
    local_208 = psVar7->_M_string_length;
    type_00._M_str = pcStack_200;
    type_00._M_len = local_208;
    Publication::Publication
              (&local_f8,bVar1 ^ GLOBAL,
               &((this->super_App).fed.
                 super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->super_ValueFederate,key_00,type_00,(string_view)units);
    Publication::Publication(&local_1f8.pub,&local_f8);
    local_1f8.generatorName._M_dataplus._M_p = (pointer)&local_1f8.generatorName.field_2;
    local_1f8.period.internalTimeCode = period.internalTimeCode;
    local_1f8.nextTime.internalTimeCode = 0;
    local_1f8.generatorIndex = -1;
    local_1f8.generatorName._M_string_length = 0;
    local_1f8.generatorName.field_2._M_local_buf[0] = '\0';
    local_f8.super_Interface._vptr_Interface = (_func_int **)&PTR__Publication_005221a8;
    if (local_f8.pubUnitType.super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8.pubUnitType.
                 super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.pubUnits._M_dataplus._M_p != &local_f8.pubUnits.field_2) {
      operator_delete(local_f8.pubUnits._M_dataplus._M_p,
                      local_f8.pubUnits.field_2._M_allocated_capacity + 1);
    }
    CLI::std::__detail::__variant::
    _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)&local_f8.prevValue);
    local_f8.super_Interface._vptr_Interface = (_func_int **)&PTR__Interface_00525a48;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.super_Interface.mName._M_dataplus._M_p !=
        &local_f8.super_Interface.mName.field_2) {
      operator_delete(local_f8.super_Interface.mName._M_dataplus._M_p,
                      local_f8.super_Interface.mName.field_2._M_allocated_capacity + 1);
    }
    if (local_228._M_len != 0) {
      iVar6 = CLI::std::
              _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
              ::find(&(this->generatorLookup)._M_t,&local_228);
      if ((_Rb_tree_header *)iVar6._M_node !=
          &(this->generatorLookup)._M_t._M_impl.super__Rb_tree_header) {
        local_1f8.generatorIndex = *(int *)&iVar6._M_node[1]._M_left;
      }
    }
    CLI::std::deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::
    emplace_back<helics::apps::SourceObject>(&this->sources,&local_1f8);
    ppSVar2 = (this->sources).
              super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppSVar3 = (this->sources).
              super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    pSVar4 = (this->sources).
             super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    pSVar10 = (this->sources).
              super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    lVar11 = (long)pSVar10 -
             (long)(this->sources).
                   super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_first;
    if (lVar11 == 0) {
      pSVar10 = ppSVar2[-1] + 2;
    }
    pSVar5 = (this->sources).
             super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    psVar8 = Interface::getName_abi_cxx11_((Interface *)(pSVar10 + -1));
    local_f8.super_Interface.mCore = (Core *)(psVar8->_M_dataplus)._M_p;
    local_f8.super_Interface._vptr_Interface = (_func_int **)psVar8->_M_string_length;
    pmVar9 = CLI::std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::operator[](&this->pubids,(key_type *)&local_f8);
    *pmVar9 = (int)((ulong)lVar11 >> 8) +
              ((int)((ulong)((long)ppSVar2 - (long)ppSVar3) >> 3) + -1 +
              (uint)(ppSVar2 == (_Map_pointer)0x0)) * 2 +
              (int)((ulong)((long)pSVar4 - (long)pSVar5) >> 8) + -1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.generatorName._M_dataplus._M_p != &local_1f8.generatorName.field_2) {
      operator_delete(local_1f8.generatorName._M_dataplus._M_p,
                      CONCAT71(local_1f8.generatorName.field_2._M_allocated_capacity._1_7_,
                               local_1f8.generatorName.field_2._M_local_buf[0]) + 1);
    }
    local_1f8.pub.super_Interface._vptr_Interface = (_func_int **)&PTR__Publication_005221a8;
    if (local_1f8.pub.pubUnitType.
        super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1f8.pub.pubUnitType.
                 super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.pub.pubUnits._M_dataplus._M_p != &local_1f8.pub.pubUnits.field_2) {
      operator_delete(local_1f8.pub.pubUnits._M_dataplus._M_p,
                      local_1f8.pub.pubUnits.field_2._M_allocated_capacity + 1);
    }
    CLI::std::__detail::__variant::
    _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)&local_1f8.pub.prevValue);
    local_1f8.pub.super_Interface._vptr_Interface = (_func_int **)&PTR__Interface_00525a48;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.pub.super_Interface.mName._M_dataplus._M_p !=
        &local_1f8.pub.super_Interface.mName.field_2) {
      operator_delete(local_1f8.pub.super_Interface.mName._M_dataplus._M_p,
                      local_1f8.pub.super_Interface.mName.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"publication already exists\n",0x1b);
  }
  return;
}

Assistant:

void Source::addPublication(std::string_view key,
                                std::string_view generator,
                                DataType type,
                                Time period,
                                std::string_view units)
    {
        // skip already existing publications
        if (pubids.find(key) != pubids.end()) {
            std::cerr << "publication already exists\n";
            return;
        }
        SourceObject newObj(Publication(useLocal ? InterfaceVisibility::LOCAL :
                                                   InterfaceVisibility::GLOBAL,
                                        fed,
                                        key,
                                        typeNameStringRef(type),
                                        units),
                            period);

        if (!generator.empty()) {
            auto res = generatorLookup.find(generator);
            if (res != generatorLookup.end()) {
                newObj.generatorIndex = res->second;
            }
        }
        sources.push_back(std::move(newObj));
        pubids[sources.back().pub.getName()] = static_cast<int>(sources.size()) - 1;
    }